

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_4>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_3,_0>
       ::run(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_4>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *mat,scalar_sum_op<double> *func)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  uVar1 = (mat->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if (uVar1 == 0) {
    __assert_fail("size && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Redux.h"
                  ,0xca,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>, 4>>, const Eigen::Matrix<double, -1, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, -1>, 4>>, const Eigen::Matrix<double, -1, 1>>, Traversal = 3, Unrolling = 0]"
                 );
  }
  uVar4 = uVar1 + 3;
  if (-1 < (long)uVar1) {
    uVar4 = uVar1;
  }
  pdVar2 = (((mat->m_lhs).m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>)
           .m_storage.m_data;
  pdVar3 = (mat->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  if (uVar1 + 1 < 3) {
    dVar7 = *pdVar2 * *pdVar3;
    if (1 < (long)uVar1) {
      uVar4 = 1;
      do {
        dVar7 = dVar7 + pdVar2[uVar4] * pdVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else {
    uVar5 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
    dVar10 = *pdVar2 * *pdVar3;
    dVar7 = pdVar2[1] * pdVar3[1];
    if (3 < (long)uVar1) {
      uVar4 = uVar4 & 0xfffffffffffffffc;
      dVar8 = pdVar2[2] * pdVar3[2];
      dVar9 = pdVar2[3] * pdVar3[3];
      if (7 < (long)uVar1) {
        lVar6 = 4;
        do {
          dVar10 = dVar10 + pdVar2[lVar6] * pdVar3[lVar6];
          dVar7 = dVar7 + (pdVar2 + lVar6)[1] * (pdVar3 + lVar6)[1];
          dVar8 = dVar8 + pdVar2[lVar6 + 2] * pdVar3[lVar6 + 2];
          dVar9 = dVar9 + (pdVar2 + lVar6 + 2)[1] * (pdVar3 + lVar6 + 2)[1];
          lVar6 = lVar6 + 4;
        } while (lVar6 < (long)uVar4);
      }
      dVar10 = dVar8 + dVar10;
      dVar7 = dVar9 + dVar7;
      if ((long)uVar4 < (long)uVar5) {
        dVar10 = dVar10 + pdVar2[uVar4] * pdVar3[uVar4];
        dVar7 = dVar7 + (pdVar2 + uVar4)[1] * (pdVar3 + uVar4)[1];
      }
    }
    dVar7 = dVar7 + dVar10;
    if ((long)uVar5 < (long)uVar1) {
      do {
        dVar7 = dVar7 + pdVar2[uVar5] * pdVar3[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  return dVar7;
}

Assistant:

static Scalar run(const Derived& mat, const Func& func)
  {
    const Index size = mat.size();
    eigen_assert(size && "you are using an empty matrix");
    const Index packetSize = packet_traits<Scalar>::size;
    const Index alignedStart = internal::first_aligned(mat);
    enum {
      alignment = bool(Derived::Flags & DirectAccessBit) || bool(Derived::Flags & AlignedBit)
                ? Aligned : Unaligned
    };
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }